

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void i_string_suite::i_string_UTF_8_invalid_sequence(void)

{
  undefined4 local_198;
  value local_194 [6];
  undefined4 local_17c;
  value local_178 [2];
  basic_string_view<char,_std::char_traits<char>_> local_170;
  undefined1 local_160 [8];
  reader reader;
  char input [11];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_7_ = 0x88d1a591e6225b;
  stack0xffffffffffffffef = 0x5d22fa;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_170,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_160,&local_170);
  local_178[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_17c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd3,"void i_string_suite::i_string_UTF_8_invalid_sequence()",local_178,&local_17c);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_160);
  local_194[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_160);
  local_198 = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xd5,"void i_string_suite::i_string_UTF_8_invalid_sequence()",local_194,&local_198);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_160);
  return;
}

Assistant:

void i_string_UTF_8_invalid_sequence()
{
    const char input[] = "[\"\xE6\x91\xA5\xD1\x88\xFA\"]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unexpected_token);
}